

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoMocUic.cxx
# Opt level: O2

bool __thiscall cmQtAutoMocUic::JobParseT::ReadFile(JobParseT *this)

{
  element_type *text;
  void *pvVar1;
  bool bVar2;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  ParseCacheT::FileT::Clear
            ((((this->FileHandle).
               super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             ParseData).
             super___shared_ptr<cmQtAutoMocUic::ParseCacheT::FileT,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  text = (this->FileHandle).
         super___shared_ptr<cmQtAutoMocUic::SourceFileT,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pvVar1 = ((this->super_JobT).super_JobT.Pool_)->UserData_;
  if (*(int *)((long)pvVar1 + 0x98) != 0) {
    cmQtAutoGen::Quoted(&local_40,&text->FileName);
    std::operator+(&local_60,"Parsing ",&local_40);
    cmQtAutoGenerator::Logger::Info((Logger *)((long)pvVar1 + 0x70),GEN,&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  bVar2 = cmQtAutoGenerator::FileRead(&this->Content,&text->FileName,&local_60);
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_60);
    if ((this->Content)._M_string_length != 0) {
      return true;
    }
    pvVar1 = ((this->super_JobT).super_JobT.Pool_)->UserData_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"The file is empty.",(allocator<char> *)&local_40);
    cmQtAutoGenerator::Logger::WarningFile
              ((Logger *)((long)pvVar1 + 0x70),GEN,&text->FileName,&local_60);
  }
  else {
    std::operator+(&local_40,"Could not read the file: ",&local_60);
    JobT::LogFileError(&this->super_JobT,GEN,&text->FileName,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::~string((string *)&local_60);
  return false;
}

Assistant:

bool cmQtAutoMocUic::JobParseT::ReadFile()
{
  // Clear old parse information
  FileHandle->ParseData->Clear();
  std::string const& fileName = FileHandle->FileName;
  // Write info
  if (Log().Verbose()) {
    Log().Info(GenT::GEN, "Parsing " + Quoted(fileName));
  }
  // Read file content
  {
    std::string error;
    if (!cmQtAutoGenerator::FileRead(Content, fileName, &error)) {
      LogFileError(GenT::GEN, fileName, "Could not read the file: " + error);
      return false;
    }
  }
  // Warn if empty
  if (Content.empty()) {
    Log().WarningFile(GenT::GEN, fileName, "The file is empty.");
    return false;
  }
  return true;
}